

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O0

void __thiscall
duckdb::StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>::
StandardColumnWriterState
          (StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>
           *this,ParquetWriter *writer,RowGroup *row_group,idx_t col_idx)

{
  ClientContext *pCVar1;
  RowGroup *in_RCX;
  ParquetWriter *in_RDX;
  ParquetWriter *in_RSI;
  undefined8 *in_RDI;
  idx_t unaff_retaddr;
  Allocator *in_stack_00000008;
  PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>
  *in_stack_00000010;
  idx_t in_stack_ffffffffffffffd8;
  undefined8 *maximum_target_capacity_p;
  
  maximum_target_capacity_p = in_RDI;
  PrimitiveColumnWriterState::PrimitiveColumnWriterState
            ((PrimitiveColumnWriterState *)in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd8);
  *in_RDI = &PTR__StandardColumnWriterState_00bfd670;
  in_RDI[0x1a] = 0;
  in_RDI[0x1b] = 0;
  *(undefined4 *)(in_RDI + 0x1c) = 0;
  pCVar1 = ParquetWriter::GetContext(in_RSI);
  duckdb::BufferAllocator::Get(pCVar1);
  ParquetWriter::DictionarySizeLimit(in_RSI);
  ParquetWriter::StringDictionaryPageSizeLimit(in_RSI);
  PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>::
  PrimitiveDictionary(in_stack_00000010,in_stack_00000008,unaff_retaddr,
                      (idx_t)maximum_target_capacity_p);
  *(undefined4 *)(in_RDI + 0x31) = 0;
  return;
}

Assistant:

StandardColumnWriterState(ParquetWriter &writer, duckdb_parquet::RowGroup &row_group, idx_t col_idx)
	    : PrimitiveColumnWriterState(writer, row_group, col_idx),
	      dictionary(BufferAllocator::Get(writer.GetContext()), writer.DictionarySizeLimit(),
	                 writer.StringDictionaryPageSizeLimit()),
	      encoding(duckdb_parquet::Encoding::PLAIN) {
	}